

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

TypeID NULLCTypeInfo::GetFunctionContextType(NULLCRef obj)

{
  ExternTypeInfo *pEVar1;
  ExternFuncInfo *pEVar2;
  char *pcVar3;
  uint uVar4;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x14d,"TypeID NULLCTypeInfo::GetFunctionContextType(NULLCRef)");
  }
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),in_stack_00000008
                     );
  if (pEVar1->subCat == CAT_FUNCTION) {
    pEVar2 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(linker + 0x240),
                        *(uint *)(CONCAT44(obj.typeID,in_stack_0000000c) + 8));
    uVar4 = 0;
    if (pEVar2->contextType != 0xffffffff) {
      uVar4 = pEVar2->contextType;
    }
  }
  else {
    pcVar3 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
    nullcThrowError("functionGetContextType: received type \'%s\' that is not a function",pcVar3);
    uVar4 = 0;
  }
  return (TypeID)uVar4;
}

Assistant:

TypeID GetFunctionContextType(NULLCRef obj)
	{
		assert(linker);

		ExternTypeInfo &type = linker->exTypes[obj.typeID];

		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("functionGetContextType: received type '%s' that is not a function", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}

		ExternFuncInfo &function = linker->exFunctions[*(int*)(obj.ptr + NULLC_PTR_SIZE)];
		return getTypeID(function.contextType != ~0u ? function.contextType : 0);
	}